

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::JavascriptString*>
          (BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
           *this,JavascriptString **key)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  JavascriptString *this_00;
  hash_t hashCode;
  uint uVar4;
  charcount_t cVar5;
  int iVar6;
  char16 *string2;
  DictionaryStats *this_01;
  uint uVar7;
  
  lVar2 = *(long *)this;
  uVar4 = 0;
  if (lVar2 != 0) {
    hashCode = GetHashCodeWithKey<Js::JavascriptString*>(key);
    uVar4 = BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar7 = *(uint *)(lVar2 + (ulong)uVar4 * 4);
    uVar4 = 0;
    if (-1 < (int)uVar7) {
      lVar2 = *(long *)(this + 8);
      uVar4 = 0;
      do {
        lVar3 = *(long *)(lVar2 + 0x10 + (ulong)uVar7 * 0x18);
        this_00 = *key;
        uVar1 = *(uint *)(lVar3 + 0x14);
        cVar5 = Js::JavascriptString::GetLength(this_00);
        if ((uVar1 >> 1 == cVar5) && (0xf < *(uint *)(lVar3 + 8))) {
          string2 = Js::JavascriptString::GetString(this_00);
          if ((char16_t *)(lVar3 + 0x18) != string2) {
            iVar6 = PAL_wmemcmp((char16_t *)(lVar3 + 0x18),string2,
                                (ulong)(*(uint *)(lVar3 + 0x14) >> 1));
            if (iVar6 != 0) goto LAB_00e32234;
          }
          this_01 = *(DictionaryStats **)(this + 0x30);
          goto LAB_00e3225d;
        }
LAB_00e32234:
        uVar4 = uVar4 + 1;
        uVar7 = *(uint *)(lVar2 + (ulong)uVar7 * 0x18 + 8);
      } while (-1 < (int)uVar7);
    }
  }
  this_01 = *(DictionaryStats **)(this + 0x30);
  uVar7 = 0xffffffff;
LAB_00e3225d:
  if (this_01 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_01,uVar4);
  }
  return uVar7;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }